

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O2

void __thiscall
S2CrossingEdgeQuery::SplitUBound
          (S2CrossingEdgeQuery *this,R2Rect *edge_bound,double u,R2Rect *child_bounds)

{
  double dVar1;
  
  dVar1 = S2::InterpolateDouble
                    (u,(this->a0_).c_[0],(this->a1_).c_[0],(this->a0_).c_[1],(this->a1_).c_[1]);
  dVar1 = R1Interval::Project(edge_bound->bounds_ + 1,dVar1);
  SplitBound(edge_bound,0,u,
             -(uint)((this->a1_).c_[0] < (this->a0_).c_[0] != (this->a1_).c_[1] < (this->a0_).c_[1])
             & 1,dVar1,child_bounds);
  return;
}

Assistant:

void S2CrossingEdgeQuery::SplitUBound(const R2Rect& edge_bound, double u,
                                      R2Rect child_bounds[2]) const {
  // See comments in MutableS2ShapeIndex::ClipUBound.
  double v = edge_bound[1].Project(
      S2::InterpolateDouble(u, a0_[0], a1_[0], a0_[1], a1_[1]));

  // "diag_" indicates which diagonal of the bounding box is spanned by a0a1:
  // it is 0 if a0a1 has positive slope, and 1 if a0a1 has negative slope.
  int diag = (a0_[0] > a1_[0]) != (a0_[1] > a1_[1]);
  SplitBound(edge_bound, 0, u, diag, v, child_bounds);
}